

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.h
# Opt level: O0

MessageOptions * __thiscall
google::protobuf::DescriptorProto::_internal_mutable_options(DescriptorProto *this)

{
  Arena *arena;
  MessageOptions *pMVar1;
  MessageOptions *p;
  DescriptorProto *this_local;
  
  if ((this->field_0)._impl_.options_ == (MessageOptions *)0x0) {
    arena = MessageLite::GetArena((MessageLite *)this);
    pMVar1 = (MessageOptions *)Arena::DefaultConstruct<google::protobuf::MessageOptions>(arena);
    (this->field_0)._impl_.options_ = pMVar1;
  }
  return (this->field_0)._impl_.options_;
}

Assistant:

inline ::google::protobuf::MessageOptions* PROTOBUF_NONNULL DescriptorProto::_internal_mutable_options() {
  ::google::protobuf::internal::TSanWrite(&_impl_);
  if (_impl_.options_ == nullptr) {
    auto* p = ::google::protobuf::Message::DefaultConstruct<::google::protobuf::MessageOptions>(GetArena());
    _impl_.options_ = reinterpret_cast<::google::protobuf::MessageOptions*>(p);
  }
  return _impl_.options_;
}